

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O1

maybe<example::aln_t> * __thiscall
rangeless::fn::impl::
catch_end<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/test/aln_filter.cpp:382:13)>
::operator()(maybe<example::aln_t> *__return_storage_ptr__,
            catch_end<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_test_aln_filter_cpp:382:13)>
            *this)

{
  ulong uVar1;
  alns_t *paVar2;
  pointer paVar3;
  undefined8 uVar4;
  aln_t local_90;
  
  if (this->ended == true) {
    __return_storage_ptr__->m_empty = true;
  }
  else {
    uVar1 = (this->gen).i;
    paVar2 = (this->gen).alns;
    paVar3 = (paVar2->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(paVar2->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)paVar3 >> 7) <= uVar1) {
      uVar4 = __cxa_allocate_exception(1);
      __cxa_throw(uVar4,&end_seq::exception::typeinfo,0);
    }
    (this->gen).i = uVar1 + 1;
    example::aln_t::aln_t(&local_90,paVar3 + uVar1);
    __return_storage_ptr__->m_empty = true;
    maybe<example::aln_t>::reset(__return_storage_ptr__);
    example::aln_t::aln_t((aln_t *)__return_storage_ptr__,&local_90);
    __return_storage_ptr__->m_empty = false;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.chr_id.first._M_dataplus._M_p != &local_90.chr_id.first.field_2) {
      operator_delete(local_90.chr_id.first._M_dataplus._M_p,
                      local_90.chr_id.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.mrna_id.first._M_dataplus._M_p != &local_90.mrna_id.first.field_2) {
      operator_delete(local_90.mrna_id.first._M_dataplus._M_p,
                      local_90.mrna_id.first.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator()() -> maybe<value_type>
        {
            if(ended) {
                return { };
            }

            try {
                return { gen() };
            } catch( const end_seq::exception& ) {
                ended = true;
                return { };
            }
        }